

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void disconnect_cpu_mapping_from_gpu_object(cpu_mapping *cpu_mapping)

{
  cpu_mapping *pcVar1;
  cpu_mapping *pcVar2;
  cpu_mapping **ppcVar3;
  
  pcVar2 = cpu_mapping->object->cpu_mappings;
  if (pcVar2 == (cpu_mapping *)0x0) {
LAB_00244dec:
    fprintf(_stdout,"ERROR: can\'t find cpu_mapping on object\'s cpu_mappings list%s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  if (pcVar2 == cpu_mapping) {
    pcVar1 = (cpu_mapping *)0x0;
  }
  else {
    do {
      pcVar1 = pcVar2;
      pcVar2 = pcVar1->next;
      if (pcVar2 == (cpu_mapping *)0x0) goto LAB_00244dec;
    } while (pcVar2 != cpu_mapping);
  }
  ppcVar3 = &pcVar1->next;
  if (pcVar1 == (cpu_mapping *)0x0) {
    ppcVar3 = &cpu_mapping->object->cpu_mappings;
  }
  *ppcVar3 = pcVar2->next;
  pcVar1 = (cpu_mapping *)0x0;
  pcVar2->next = (cpu_mapping *)0x0;
  cpu_mapping->object = (gpu_object *)0x0;
  cpu_mapping->object_offset = 0;
  cpu_mapping->data = (uint8_t *)0x0;
  if (cpu_mapping->id <= max_id && max_id != 0xffffffff) {
    pcVar1 = cpu_mappings[cpu_mapping->id];
  }
  if (pcVar1 == cpu_mapping) {
    return;
  }
  free(cpu_mapping);
  return;
}

Assistant:

void disconnect_cpu_mapping_from_gpu_object(struct cpu_mapping *cpu_mapping)
{
	struct gpu_object *obj = cpu_mapping->object;
	struct cpu_mapping *it, *prev = NULL;
	for (it = obj->cpu_mappings; it != NULL; prev = it, it = it->next)
		if (it == cpu_mapping)
		{
			if (prev)
				prev->next = it->next;
			else
				obj->cpu_mappings = it->next;
			it->next = NULL;
			cpu_mapping->object = NULL;
			cpu_mapping->object_offset = 0;
			cpu_mapping->data = NULL;

			if (get_cpu_mapping(cpu_mapping->id) != cpu_mapping)
				free(cpu_mapping);

			return;
		}
	mmt_error("can't find cpu_mapping on object's cpu_mappings list%s\n", "");
	demmt_abort();
}